

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

void __thiscall icu_63::ICUNumberFormatService::ICUNumberFormatService(ICUNumberFormatService *this)

{
  ICUResourceBundleFactory *this_00;
  UnicodeString *dname;
  UErrorCode status;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UnicodeString local_58;
  
  local_70.p_ = L"Number Format";
  UnicodeString::UnicodeString(&local_58,'\x01',&local_70,-1);
  dname = &local_58;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString(&local_58);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUNumberFormatService_003b1290;
  local_58.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
  this_00 = (ICUResourceBundleFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 != (ICUResourceBundleFactory *)0x0) {
    memset(this_00,0,0x90);
    ICUResourceBundleFactory::ICUResourceBundleFactory(this_00);
    (this_00->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
         (_func_int **)&PTR__ICUNumberFormatFactory_003b1208;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&local_58);
  return;
}

Assistant:

ICUNumberFormatService()
        : ICULocaleService(UNICODE_STRING_SIMPLE("Number Format"))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUNumberFormatFactory(), status);
    }